

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O1

void NOPN2_PhaseCalcIncrement(ym3438_t *chip)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  ushort uVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  byte bVar9;
  uint uVar10;
  
  uVar2 = chip->cycles;
  bVar6 = chip->lfo_pm & 0xf;
  bVar1 = chip->pms[chip->channel];
  bVar5 = bVar6 ^ 0xf;
  if (bVar6 < 8) {
    bVar5 = bVar6;
  }
  bVar6 = chip->dt[uVar2];
  uVar8 = 0;
  bVar7 = bVar6 & 3;
  if (bVar7 != 0) {
    bVar9 = 0x1c;
    if (chip->pg_kcode < 0x1c) {
      bVar9 = chip->pg_kcode;
    }
    uVar8 = pg_detune[((bVar7 == 3) + (bVar9 >> 2)) * '\x04' + 0x24 & 4 | bVar9 & 3] >>
            (9 - ((byte)((bVar6 & 2 | bVar7 == 3) + (bVar9 >> 2) + 9) >> 1) & 0x1f) & 0xff;
  }
  uVar4 = chip->pg_fnum >> 4;
  bVar7 = 0;
  if (5 < bVar1) {
    bVar7 = bVar1 - 5;
  }
  uVar10 = ((uint)(uVar4 >> ((byte)pg_lfo_sh2[bVar1][bVar5] & 0x1f)) +
            (uint)(uVar4 >> ((byte)pg_lfo_sh1[bVar1][bVar5] & 0x1f)) << (bVar7 & 0x1f)) >> 2;
  uVar3 = -uVar10;
  if ((chip->lfo_pm & 0x10) == 0) {
    uVar3 = uVar10;
  }
  uVar10 = -uVar8;
  if ((bVar6 & 4) == 0) {
    uVar10 = uVar8;
  }
  chip->pg_inc[uVar2] =
       (uint)chip->multi[uVar2] *
       (uVar10 + (((uVar3 + (uint)chip->pg_fnum * 2 & 0xfff) << (chip->pg_block & 0x1f)) >> 2) &
       0x1ffff) >> 1 & 0xfffff;
  return;
}

Assistant:

void NOPN2_PhaseCalcIncrement(ym3438_t *chip)
{
    Bit32u chan = chip->channel;
    Bit32u slot = chip->cycles;
    Bit32u fnum = chip->pg_fnum;
    Bit32u fnum_h = fnum >> 4;
    Bit32u fm;
    Bit32u basefreq;
    Bit8u lfo = chip->lfo_pm;
    Bit8u lfo_l = lfo & 0x0f;
    Bit8u pms = chip->pms[chan];
    Bit8u dt = chip->dt[slot];
    Bit8u dt_l = dt & 0x03;
    Bit8u detune = 0;
    Bit8u block, note;
    Bit8u sum, sum_h, sum_l;
    Bit8u kcode = chip->pg_kcode;

    fnum <<= 1;
    /* Apply LFO */
    if (lfo_l & 0x08)
    {
        lfo_l ^= 0x0f;
    }
    fm = (fnum_h >> pg_lfo_sh1[pms][lfo_l]) + (fnum_h >> pg_lfo_sh2[pms][lfo_l]);
    if (pms > 5)
    {
        fm <<= pms - 5;
    }
    fm >>= 2;
    if (lfo & 0x10)
    {
        fnum -= fm;
    }
    else
    {
        fnum += fm;
    }
    fnum &= 0xfff;

    basefreq = (fnum << chip->pg_block) >> 2;

    /* Apply detune */
    if (dt_l)
    {
        if (kcode > 0x1c)
        {
            kcode = 0x1c;
        }
        block = kcode >> 2;
        note = kcode & 0x03;
        sum = block + 9 + ((dt_l == 3) | (dt_l & 0x02));
        sum_h = sum >> 1;
        sum_l = sum & 0x01;
        detune = pg_detune[(sum_l << 2) | note] >> (9 - sum_h);
    }
    if (dt & 0x04)
    {
        basefreq -= detune;
    }
    else
    {
        basefreq += detune;
    }
    basefreq &= 0x1ffff;
    chip->pg_inc[slot] = (basefreq * chip->multi[slot]) >> 1;
    chip->pg_inc[slot] &= 0xfffff;
}